

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O0

void __thiscall amrex::CoordSys::GetFaceArea(CoordSys *this,FArrayBox *area,Box *region,int dir)

{
  uint uVar1;
  FArrayBox *this_00;
  undefined8 uVar2;
  int in_ECX;
  undefined8 *in_RDX;
  undefined8 in_RDI;
  int in_stack_0000000c;
  Box *in_stack_00000010;
  Box reg;
  Arena *in_stack_ffffffffffffff58;
  undefined8 local_88;
  int aiStack_84 [3];
  IndexType local_78 [10];
  Box *local_50;
  IndexType *local_40;
  undefined4 local_38;
  int *local_30;
  IndexType *local_20;
  IndexType *local_10;
  
  this_00 = (FArrayBox *)*in_RDX;
  local_88 = in_RDX[1];
  uVar2 = in_RDX[2];
  uVar1 = *(uint *)(in_RDX + 3);
  local_78[0].itype = uVar1;
  if ((uVar1 & 1 << ((byte)in_ECX & 0x1f)) == 0) {
    local_38 = 1;
    ((int *)((long)register0x00000020 + -0x84))[in_ECX] =
         ((int *)((long)register0x00000020 + -0x84))[in_ECX] + 1;
    local_20 = local_78;
    local_78[0].itype = 1 << ((byte)in_ECX & 0x1f) | uVar1;
    local_30 = (int *)((long)register0x00000020 + -0x84);
  }
  aiStack_84._4_8_ = uVar2;
  local_50 = (Box *)&stack0xffffffffffffff70;
  local_40 = local_78;
  local_10 = local_78;
  FArrayBox::resize(this_00,(Box *)&stack0xffffffffffffff70,(int)((ulong)in_RDI >> 0x20),
                    in_stack_ffffffffffffff58);
  SetFaceArea((CoordSys *)reg._8_8_,(FArrayBox *)reg.smallend.vect._0_8_,in_stack_00000010,
              in_stack_0000000c);
  return;
}

Assistant:

void
CoordSys::GetFaceArea (FArrayBox& area,
                       const Box& region,
                       int        dir) const
{
    Box reg(region);
    reg.surroundingNodes(dir);
    area.resize(reg,1);
    SetFaceArea(area,reg,dir);
}